

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jas_string.c
# Opt level: O3

char * jas_strdup(char *s)

{
  size_t sVar1;
  char *pcVar2;
  
  sVar1 = strlen(s);
  pcVar2 = (char *)jas_malloc(sVar1 + 1);
  if (pcVar2 != (char *)0x0) {
    pcVar2 = strcpy(pcVar2,s);
    return pcVar2;
  }
  return (char *)0x0;
}

Assistant:

char *jas_strdup(const char *s)
{
	size_t n;
	char *p;
	n = strlen(s) + 1;
	if (!(p = jas_malloc(n))) {
		return 0;
	}
	strcpy(p, s);
	return p;
}